

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::NanoVDBMediumProvider::Le(NanoVDBMediumProvider *this,Point3f *p,SampledWavelengths *lambda)

{
  Float FVar1;
  undefined1 auVar2 [16];
  float T;
  ValueT VVar3;
  undefined1 auVar5 [56];
  undefined8 uVar6;
  undefined1 auVar8 [56];
  undefined1 auVar9 [16];
  Vec3<float> xyz;
  SampledSpectrum SVar10;
  Vec3<float> local_38;
  undefined1 local_28 [8];
  float fStack_20;
  float fStack_1c;
  undefined1 auVar4 [64];
  undefined1 auVar7 [64];
  
  uVar6 = 0;
  if (this->temperatureFloatGrid == (FloatGrid *)0x0) {
    auVar9._0_8_ = 0;
  }
  else {
    local_38.mVec[2] = (p->super_Tuple3<pbrt::Point3,_float>).z;
    local_38.mVec[0] = (p->super_Tuple3<pbrt::Point3,_float>).x;
    local_38.mVec[1] = (p->super_Tuple3<pbrt::Point3,_float>).y;
    xyz = nanovdb::Map::applyInverseMapF<nanovdb::Vec3<float>>
                    (&(this->densityFloatGrid->super_GridData).mMap,&local_38);
    local_38.mVec._0_8_ = this->temperatureFloatGrid + 1;
    VVar3 = nanovdb::
            SampleFromVoxels<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>,_1,_false>
            ::operator()<float,_nanovdb::Vec3>
                      ((SampleFromVoxels<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>,_1,_false>
                        *)&local_38,xyz);
    uVar6 = 0;
    T = (VVar3 - this->temperatureCutoff) * this->temperatureScale;
    auVar5 = (undefined1  [56])0x0;
    auVar9._0_8_ = 0;
    if (100.0 < T) {
      FVar1 = this->LeScale;
      local_28._4_4_ = FVar1;
      local_28._0_4_ = FVar1;
      fStack_20 = FVar1;
      fStack_1c = FVar1;
      auVar8 = ZEXT856(local_28._8_8_);
      BlackbodySpectrum::BlackbodySpectrum((BlackbodySpectrum *)&local_38,T);
      SVar10 = BlackbodySpectrum::Sample((BlackbodySpectrum *)&local_38,lambda);
      auVar7._0_8_ = SVar10.values.values._8_8_;
      auVar7._8_56_ = auVar8;
      auVar4._0_8_ = SVar10.values.values._0_8_;
      auVar4._8_56_ = auVar5;
      auVar2 = vmovlhps_avx(auVar4._0_16_,auVar7._0_16_);
      auVar9._0_8_ = CONCAT44(auVar2._4_4_ * (float)local_28._4_4_,
                              auVar2._0_4_ * (float)local_28._0_4_);
      auVar9._8_4_ = auVar2._8_4_ * fStack_20;
      auVar9._12_4_ = auVar2._12_4_ * fStack_1c;
      auVar2 = vshufpd_avx(auVar9,auVar9,1);
      uVar6 = auVar2._0_8_;
    }
  }
  SVar10.values.values[2] = (float)(int)uVar6;
  SVar10.values.values[3] = (float)(int)((ulong)uVar6 >> 0x20);
  SVar10.values.values[0] = (float)(int)auVar9._0_8_;
  SVar10.values.values[1] = (float)(int)((ulong)auVar9._0_8_ >> 0x20);
  return (SampledSpectrum)SVar10.values.values;
}

Assistant:

Le(const Point3f &p, const SampledWavelengths &lambda) const {
        if (!temperatureFloatGrid)
            return SampledSpectrum(0.f);
        nanovdb::Vec3<float> pIndex =
            densityFloatGrid->worldToIndexF(nanovdb::Vec3<float>(p.x, p.y, p.z));
        using Sampler = nanovdb::SampleFromVoxels<nanovdb::FloatGrid::TreeType, 1, false>;
        Float temp = Sampler(temperatureFloatGrid->tree())(pIndex);
        temp = (temp - temperatureCutoff) * temperatureScale;
        if (temp <= 100.f)
            return SampledSpectrum(0.f);
        return LeScale * BlackbodySpectrum(temp).Sample(lambda);
    }